

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O0

bool __thiscall util::fs::File::operator<(File *this,File *rhs)

{
  bool bVar1;
  File *rhs_local;
  File *this_local;
  
  if (((this->is_dir & 1U) == 0) || ((rhs->is_dir & 1U) != 0)) {
    if (((this->is_dir & 1U) == 0) && ((rhs->is_dir & 1U) != 0)) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = std::operator<(&this->path,&rhs->path);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        bVar1 = std::operator<(&rhs->path,&this->path);
        if (bVar1) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = std::operator<(&this->name,&rhs->name);
        }
      }
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
File::operator< (File const& rhs) const
{
    if (this->is_dir && !rhs.is_dir)
        return true;
    else if (!this->is_dir && rhs.is_dir)
        return false;
    else if (this->path < rhs.path)
        return true;
    else if (rhs.path < this->path)
        return false;
    else
        return (this->name < rhs.name);
}